

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

_Bool m68k_cpu_exec_interrupt_m68k(CPUState *cs,int interrupt_request)

{
  M68kCPU *cpu;
  
  if (((interrupt_request & 2U) != 0) &&
     ((*(uint *)((long)cs[1].tb_jmp_cache + 0x4bc) >> 8 & 7) < *(uint *)(cs[1].tb_jmp_cache + 0xc0))
     ) {
    cs->exception_index = *(int32_t *)((long)cs[1].tb_jmp_cache + 0x5fc);
    do_interrupt_all((CPUM68KState_conflict *)(cs[1].tb_jmp_cache + 0x8f),1);
    return true;
  }
  return false;
}

Assistant:

bool m68k_cpu_exec_interrupt(CPUState *cs, int interrupt_request)
{
    M68kCPU *cpu = M68K_CPU(cs);
    CPUM68KState *env = &cpu->env;

    if (interrupt_request & CPU_INTERRUPT_HARD
        && ((env->sr & SR_I) >> SR_I_SHIFT) < env->pending_level) {
        /*
         * Real hardware gets the interrupt vector via an IACK cycle
         * at this point.  Current emulated hardware doesn't rely on
         * this, so we provide/save the vector when the interrupt is
         * first signalled.
         */
        cs->exception_index = env->pending_vector;
        do_interrupt_m68k_hardirq(env);
        return true;
    }
    return false;
}